

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal.c
# Opt level: O2

int Qiniu_Is(Qiniu_Eq *self)

{
  Qiniu_Writer w;
  Qiniu_Error QVar1;
  Qiniu_Int64 ncopy;
  long local_18;
  
  if (self->result != 0) {
    w.Write = Qiniu_Discard.Write;
    w.self = Qiniu_Discard.self;
    w.Flush = Qiniu_Discard.Flush;
    QVar1 = Qiniu_Copy(w,self->v,(void *)0x0,0x400,&local_18);
    Qiniu_Stderr_Info("Qiniu_Is: copy.n = %D, copy.err = %E",local_18,(ulong)(uint)QVar1.code,
                      QVar1.message);
    return (int)(local_18 == 0 && QVar1.code == 200);
  }
  return 0;
}

Assistant:

int Qiniu_Is(Qiniu_Eq *self)
{
	Qiniu_Int64 ncopy;
	Qiniu_Error err;
	if (self->result)
	{
		err = Qiniu_Copy(Qiniu_Discard, self->v, NULL, 1024, &ncopy);
		Qiniu_Log_Info("Qiniu_Is: copy.n = %D, copy.err = %E", ncopy, err);
		return err.code == 200 && ncopy == 0;
	}
	return 0;
}